

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::Ifc2DCompositeCurve::~Ifc2DCompositeCurve(Ifc2DCompositeCurve *this)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *pvVar2;
  
  lVar1 = *(long *)((long)(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
                          super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          _vptr_ObjectHelper + -0x18);
  *(undefined8 *)
   ((long)&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
           super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper + lVar1) = 0x900aa8;
  *(undefined8 *)(&(this->super_IfcCompositeCurve).field_0x88 + lVar1) = 0x900b70;
  *(undefined8 *)
   ((long)&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
           super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 +
   lVar1) = 0x900ad0;
  *(undefined8 *)
   ((long)&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
           super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 +
   lVar1) = 0x900af8;
  *(undefined8 *)
   (&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
     super_IfcGeometricRepresentationItem.field_0x30 + lVar1) = 0x900b20;
  *(undefined8 *)
   (&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.field_0x40 + lVar1) =
       0x900b48;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)&(this->super_IfcCompositeCurve).SelfIntersect.
                     super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + lVar1);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pvVar2 = *(void **)(&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.field_0x50 + lVar1);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)(&(this->super_IfcCompositeCurve).field_0x60 + lVar1) -
                           (long)pvVar2);
    return;
  }
  return;
}

Assistant:

Ifc2DCompositeCurve() : Object("Ifc2DCompositeCurve") {}